

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-defs.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::addElem
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Name param_1,Name *table,
          optional<wasm::Expression_*> offset,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *elems,Index pos)

{
  Expression *pEVar1;
  value_type *__x;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar2;
  bool bVar3;
  Expression **ppEVar4;
  size_type sVar5;
  reference this_00;
  pointer pTVar6;
  pointer pEVar7;
  Ok local_a9;
  Name local_a8 [2];
  allocator<char> local_81;
  string local_80;
  Err local_60;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *local_40;
  value_type *e;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *elems_local;
  Name *table_local;
  ParseDefsCtx *this_local;
  Name param_1_local;
  
  param_1_local.super_IString.str._M_len = param_1.super_IString.str._M_str;
  this_local = param_1.super_IString.str._M_len;
  e = (value_type *)elems;
  elems_local = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)table;
  table_local = (Name *)this;
  param_1_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  local_40 = std::
             vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ::operator[](&this->wasm->elementSegments,(ulong)this->index);
  bVar3 = std::optional::operator_cast_to_bool((optional *)&offset);
  if (bVar3) {
    ppEVar4 = std::optional<wasm::Expression_*>::operator*(&offset);
    pEVar1 = *ppEVar4;
    pEVar7 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(local_40);
    pvVar2 = elems_local;
    pEVar7->offset = pEVar1;
    if (elems_local == (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)0x0) {
      sVar5 = std::
              vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ::size(&this->wasm->tables);
      if (sVar5 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"active element segment with no table",&local_81);
        Lexer::err(&local_60,&this->in,(ulong)pos,&local_80);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_60);
        wasm::Err::~Err(&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator(&local_81);
        return __return_storage_ptr__;
      }
      this_00 = std::
                vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ::operator[](&this->wasm->tables,0);
      pTVar6 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_00);
      pEVar7 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
               operator->(local_40);
      wasm::Name::operator=(&pEVar7->table,(Name *)pTVar6);
    }
    else {
      pEVar7 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
               operator->(local_40);
      wasm::Name::operator=(&pEVar7->table,(Name *)pvVar2);
    }
  }
  else {
    pEVar7 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(local_40);
    pEVar7->offset = (Expression *)0x0;
    wasm::Name::Name(local_a8);
    pEVar7 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(local_40);
    wasm::Name::operator=(&pEVar7->table,local_a8);
  }
  __x = e;
  pEVar7 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(local_40);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator=
            (&pEVar7->data,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)__x);
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_a9);
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDefsCtx::addElem(Name,
                               Name* table,
                               std::optional<Expression*> offset,
                               std::vector<Expression*>&& elems,
                               Index pos) {
  auto& e = wasm.elementSegments[index];
  if (offset) {
    e->offset = *offset;
    if (table) {
      e->table = *table;
    } else if (wasm.tables.size() > 0) {
      e->table = wasm.tables[0]->name;
    } else {
      return in.err(pos, "active element segment with no table");
    }
  } else {
    e->offset = nullptr;
    e->table = Name();
  }
  e->data = std::move(elems);
  return Ok{};
}